

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonEachOpenEach(sqlite3_vtab *p,sqlite3_vtab_cursor **ppCursor)

{
  sqlite3_vtab_cursor *__s;
  JsonEachCursor *pCur;
  sqlite3_vtab_cursor **ppCursor_local;
  sqlite3_vtab *p_local;
  
  __s = (sqlite3_vtab_cursor *)sqlite3_malloc(0x60);
  if (__s == (sqlite3_vtab_cursor *)0x0) {
    p_local._4_4_ = 7;
  }
  else {
    memset(__s,0,0x60);
    *ppCursor = __s;
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int jsonEachOpenEach(sqlite3_vtab *p, sqlite3_vtab_cursor **ppCursor){
  JsonEachCursor *pCur;

  UNUSED_PARAMETER(p);
  pCur = sqlite3_malloc( sizeof(*pCur) );
  if( pCur==0 ) return SQLITE_NOMEM;
  memset(pCur, 0, sizeof(*pCur));
  *ppCursor = &pCur->base;
  return SQLITE_OK;
}